

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O0

mz_bool mz_zip_writer_init(mz_zip_archive *pZip,mz_uint64 existing_size)

{
  mz_zip_internal_state *pmVar1;
  mz_uint64 existing_size_local;
  mz_zip_archive *pZip_local;
  
  if ((((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState != (mz_zip_internal_state *)0x0)) ||
      (pZip->m_pWrite == (mz_file_write_func)0x0)) || (pZip->m_zip_mode != MZ_ZIP_MODE_INVALID)) {
    pZip_local._4_4_ = 0;
  }
  else if ((pZip->m_file_offset_alignment == 0) ||
          ((pZip->m_file_offset_alignment & pZip->m_file_offset_alignment - 1) == 0)) {
    if (pZip->m_pAlloc == (mz_alloc_func)0x0) {
      pZip->m_pAlloc = def_alloc_func;
    }
    if (pZip->m_pFree == (mz_free_func)0x0) {
      pZip->m_pFree = def_free_func;
    }
    if (pZip->m_pRealloc == (mz_realloc_func)0x0) {
      pZip->m_pRealloc = def_realloc_func;
    }
    pZip->m_zip_mode = MZ_ZIP_MODE_WRITING;
    pZip->m_archive_size = existing_size;
    pZip->m_central_directory_file_ofs = 0;
    pZip->m_total_files = 0;
    pmVar1 = (mz_zip_internal_state *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x80);
    pZip->m_pState = pmVar1;
    if (pmVar1 == (mz_zip_internal_state *)0x0) {
      pZip_local._4_4_ = 0;
    }
    else {
      memset(pZip->m_pState,0,0x80);
      (pZip->m_pState->m_central_dir).m_element_size = 1;
      (pZip->m_pState->m_central_dir_offsets).m_element_size = 4;
      (pZip->m_pState->m_sorted_central_dir_offsets).m_element_size = 4;
      pZip_local._4_4_ = 1;
    }
  }
  else {
    pZip_local._4_4_ = 0;
  }
  return pZip_local._4_4_;
}

Assistant:

mz_bool mz_zip_writer_init(mz_zip_archive *pZip, mz_uint64 existing_size)
{
  if ((!pZip) || (pZip->m_pState) || (!pZip->m_pWrite) || (pZip->m_zip_mode != MZ_ZIP_MODE_INVALID))
    return MZ_FALSE;

  if (pZip->m_file_offset_alignment)
  {
    // Ensure user specified file offset alignment is a power of 2.
    if (pZip->m_file_offset_alignment & (pZip->m_file_offset_alignment - 1))
      return MZ_FALSE;
  }

  if (!pZip->m_pAlloc) pZip->m_pAlloc = def_alloc_func;
  if (!pZip->m_pFree) pZip->m_pFree = def_free_func;
  if (!pZip->m_pRealloc) pZip->m_pRealloc = def_realloc_func;

  pZip->m_zip_mode = MZ_ZIP_MODE_WRITING;
  pZip->m_archive_size = existing_size;
  pZip->m_central_directory_file_ofs = 0;
  pZip->m_total_files = 0;

  if (NULL == (pZip->m_pState = (mz_zip_internal_state *)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(mz_zip_internal_state))))
    return MZ_FALSE;
  memset(pZip->m_pState, 0, sizeof(mz_zip_internal_state));
  MZ_ZIP_ARRAY_SET_ELEMENT_SIZE(&pZip->m_pState->m_central_dir, sizeof(mz_uint8));
  MZ_ZIP_ARRAY_SET_ELEMENT_SIZE(&pZip->m_pState->m_central_dir_offsets, sizeof(mz_uint32));
  MZ_ZIP_ARRAY_SET_ELEMENT_SIZE(&pZip->m_pState->m_sorted_central_dir_offsets, sizeof(mz_uint32));
  return MZ_TRUE;
}